

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall
Memory::Recycler::ProcessObjectBeforeCollectCallbacks(Recycler *this,bool atShutdown)

{
  RealCount *pRVar1;
  HeapBlockMap *this_00;
  ObjectBeforeCollectCallbackList *pOVar2;
  void *address;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSVar3;
  ObjectBeforeCollectCallbackList *pOVar4;
  code *pcVar5;
  Type pSVar6;
  Type pSVar7;
  Type pSVar8;
  SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *buffer;
  undefined1 auVar9 [8];
  bool bVar10;
  bool bVar11;
  undefined4 *puVar12;
  Type *pTVar13;
  undefined7 extraout_var;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  **ppSVar14;
  Type pSVar15;
  undefined1 local_a0 [8];
  EditingIterator iter;
  AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>
  autoInObjectBeforeCollectCallback;
  Iterator local_60;
  Recycler *local_50;
  undefined1 local_48 [8];
  AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
  oldCallbackList;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pOVar2 = this->objectBeforeCollectCallbackList;
  if (pOVar2 != (ObjectBeforeCollectCallbackList *)0x0) {
    if ((!atShutdown) &&
       (((this->collectionState).value & CollectionStateMark) == CollectionStateNotCollecting)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                          ,0x2345,"(atShutdown || this->IsMarkState())",
                          "atShutdown || this->IsMarkState()");
      if (!bVar10) goto LAB_0071a634;
      *puVar12 = 0;
    }
    if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                          ,0x2347,"(!this->IsInObjectBeforeCollectCallback())",
                          "!this->IsInObjectBeforeCollectCallback()");
      if (!bVar10) {
LAB_0071a634:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar12 = 0;
    }
    iter.super_EditingIterator.last._0_4_ = atShutdown + ObjectBeforeCollectCallback_Normal;
    this->objectBeforeCollectCallbackState =
         (ObjectBeforeCollectCallbackState)iter.super_EditingIterator.last;
    local_48 = (undefined1  [8])this->objectBeforeCollectCallbackList;
    oldCallbackList.
    super_BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
    .ptr = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
            *)&this->objectBeforeCollectCallbackArena;
    this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)0x0;
    local_a0 = (undefined1  [8])
               BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
               ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                             *)local_48);
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    this_00 = &this->heapBlockMap;
    oldCallbackList.m_allocator._4_4_ = 0;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
          *)local_a0;
    local_50 = this;
    while (bVar10 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                    ::EditingIterator::Next((EditingIterator *)local_a0), auVar9 = local_48, bVar10)
    {
      pTVar13 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)local_a0);
      bVar10 = true;
      if (pTVar13->callback != (ObjectBeforeCollectCallback)0x0) {
        address = pTVar13->object;
        if ((atShutdown) || (bVar11 = HeapBlockMap64::IsMarked(this_00,address), !bVar11)) {
          if (pTVar13->callbackWrapper == (ObjectBeforeCollectCallbackWrapper)0x0) {
            (*pTVar13->callback)(address,pTVar13->callbackState);
          }
          else {
            (*pTVar13->callbackWrapper)
                      (pTVar13->callback,address,pTVar13->callbackState,pTVar13->threadContext);
          }
        }
        else {
          oldCallbackList.m_allocator._4_4_ = (uint)CONCAT71(extraout_var,1);
          bVar10 = false;
        }
      }
      this = local_50;
      buffer = iter.super_EditingIterator.super_Iterator.list;
      if (bVar10) {
        this_01 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
                   ((long)local_a0 + 0x10);
        SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_a0);
        ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (this_01,buffer,0x30);
      }
    }
    if ((oldCallbackList.m_allocator._4_4_ & 1) != 0) {
      pSVar3 = this->objectBeforeCollectCallbackList;
      local_48 = (undefined1  [8])0x0;
      if (pSVar3 == (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                     *)0x0) {
        this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)auVar9;
      }
      else {
        ppSVar14 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                   ::operator&((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                                *)local_48);
        *ppSVar14 = pSVar3;
        this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)auVar9;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)&oldCallbackList.m_allocator,
                   ExceptionType_OutOfMemory);
        local_60.list =
             &BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
              ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                            *)local_48)->
              super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        ;
        local_60.current = &(local_60.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        while( true ) {
          if ((SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
               *)local_60.current ==
              (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar10) goto LAB_0071a634;
            *puVar12 = 0;
          }
          local_60.current =
               (((SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                  *)&(local_60.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if ((SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
               *)local_60.current == local_60.list) break;
          pTVar13 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data(&local_60);
          pOVar4 = local_50->objectBeforeCollectCallbackList;
          pSVar15 = (Type)new<Memory::ArenaAllocator>(0x30,pOVar4->allocator,0x366bee);
          pSVar15[5].next = (Type)pTVar13->callbackWrapper;
          pSVar6 = (Type)pTVar13->object;
          pSVar7 = (Type)pTVar13->callback;
          pSVar8 = (Type)pTVar13->threadContext;
          pSVar15[3].next = (Type)pTVar13->callbackState;
          pSVar15[4].next = pSVar8;
          pSVar15[1].next = pSVar6;
          pSVar15[2].next = pSVar7;
          pSVar15->next =
               (pOVar4->
               super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
               ).super_SListNodeBase<Memory::ArenaAllocator>.next;
          (pOVar4->
          super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
          ).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar15;
          pRVar1 = &(pOVar4->
                    super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                    ).super_RealCount;
          pRVar1->count = pRVar1->count + 1;
        }
        local_60.current =
             (NodeBase *)
             (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
              *)0x0;
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)&oldCallbackList.m_allocator);
      }
    }
    AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
    ::Clear((AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
             *)local_48);
    AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>::~AutoRestoreValue
              ((AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState> *)
               &iter.super_EditingIterator.last);
  }
  return pOVar2 != (ObjectBeforeCollectCallbackList *)0x0;
}

Assistant:

bool Recycler::ProcessObjectBeforeCollectCallbacks(bool atShutdown/*= false*/)
{
    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        return false; // no callbacks
    }
    Assert(atShutdown || this->IsMarkState());

    Assert(!this->IsInObjectBeforeCollectCallback());
    AutoRestoreValue<ObjectBeforeCollectCallbackState> autoInObjectBeforeCollectCallback(&objectBeforeCollectCallbackState,
        atShutdown ? ObjectBeforeCollectCallback_Shutdown : ObjectBeforeCollectCallback_Normal);

    // The callbacks may register/unregister callbacks while we are enumerating the current map. To avoid
    // conflicting usage of the callback map, we swap it out. New registration will go to a new map.
    AutoAllocatorObjectPtr<ObjectBeforeCollectCallbackList, ArenaAllocator> oldCallbackList(
        this->objectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    this->objectBeforeCollectCallbackList = nullptr;

    bool hasRemainingCallbacks = false;
    FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, data, oldCallbackList, iter)
    {
        bool remove = true;
        if (data.callback != nullptr)
        {
            void* object = data.object;
            if (atShutdown || !this->IsObjectMarked(object))
            {
                if (data.callbackWrapper != nullptr)
                {
                    data.callbackWrapper(data.callback, object, data.callbackState, data.threadContext);
                }
                else
                {
                    data.callback(object, data.callbackState);
                }
            }
            else
            {
                hasRemainingCallbacks = true;
                remove = false; // Do not remove this entry, remaining callback for future
            }
        }
        if (remove)
        {
            iter.RemoveCurrent();
        }
    } NEXT_SLIST_ENTRY_EDITING;

    // Merge back remaining callbacks if any
    if (hasRemainingCallbacks)
    {
        if (this->objectBeforeCollectCallbackList == nullptr)
        {
            this->objectBeforeCollectCallbackList = oldCallbackList.Detach();
        }
        else
        {
            // Swap back, since old list is likely larger
            ObjectBeforeCollectCallbackList* tmp = oldCallbackList.Detach();
            *&oldCallbackList = this->objectBeforeCollectCallbackList;
            this->objectBeforeCollectCallbackList = tmp;

            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
                oldCallbackList->Map([&](const ObjectBeforeCollectCallbackData& data)
                {
                    this->objectBeforeCollectCallbackList->Push(data);
                });
            }
            catch (Js::OutOfMemoryException)
            {
                // can't recover from OOM here
                AssertOrFailFast(UNREACHED);
            }
        }
    }

    return true; // maybe called callbacks
}